

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::findNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,bool writeDeclaration,
          bool noDefault)

{
  QStringView rhs;
  QAnyStringView s_00;
  QAnyStringView s_01;
  bool bVar1;
  qsizetype qVar2;
  byte in_CL;
  QXmlStreamWriterPrivate *in_RDX;
  NamespaceDeclaration *in_RSI;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  qsizetype j;
  int n;
  NamespaceDeclaration *namespaceDeclaration;
  NamespaceDeclaration *namespaceDeclaration_1;
  R_conflict23 *__range1;
  QString s;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> __end1;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> __begin1;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_stack_fffffffffffffe50;
  NamespaceDeclaration *in_stack_fffffffffffffe58;
  uint7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 uVar3;
  storage_type_conflict *in_stack_fffffffffffffe78;
  QXmlStreamPrivateTagStack *in_stack_fffffffffffffe80;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  reference local_128;
  QString *local_100;
  qsizetype local_f8;
  qsizetype local_f0;
  QString *local_d8;
  qsizetype local_d0;
  qsizetype local_c8;
  storage_type_conflict local_40 [8];
  undefined1 *local_30;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> local_28;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *local_20;
  NamespaceDeclaration *local_18;
  QXmlStreamWriterPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  local_10 = in_RDX;
  local_20 = (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
             (anonymous_namespace)::
             reversed<QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>>
                       (in_RDI);
  local_28.current = (NamespaceDeclaration *)&DAT_aaaaaaaaaaaaaaaa;
  R::begin((R_conflict23 *)in_stack_fffffffffffffe58);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  R::end((R_conflict23 *)in_stack_fffffffffffffe58);
  while (bVar1 = std::operator!=((reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>
                                  *)in_stack_fffffffffffffe50,
                                 (reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>
                                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)),
        bVar1) {
    local_128 = std::reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>::operator*
                          (&local_28);
    in_stack_fffffffffffffe78 = local_40;
    in_stack_fffffffffffffe80 =
         (QXmlStreamPrivateTagStack *)std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64d1ec);
    QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64d1fe);
    QAnyStringView::QAnyStringView<QChar,_true>
              ((QAnyStringView *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (QChar *)in_stack_fffffffffffffe58,(qsizetype)in_stack_fffffffffffffe50);
    bVar1 = ::operator==((QAnyStringView *)in_stack_fffffffffffffe50,
                         (QAnyStringView *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if ((bVar1) &&
       (((in_R8B & 1) == 0 || (bVar1 = QtPrivate::XmlStringRef::isEmpty(&local_128->prefix), !bVar1)
        ))) goto LAB_0064d5df;
    std::reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>::operator++(&local_28);
  }
  bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x64d286);
  if (bVar1) {
    local_128 = (reference)&in_RDI[6].cap;
  }
  else {
    local_128 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                          (in_stack_fffffffffffffe50);
    bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x64d2cf);
    if (bVar1) {
      QtPrivate::XmlStringRef::clear(&local_128->prefix);
    }
    else {
      QString::QString((QString *)0x64d31e);
      *(int *)&in_RDI[9].data = *(int *)&in_RDI[9].data + 1;
      do {
        QString::number(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        ::operator+((char16_t *)in_stack_fffffffffffffe58,(QString *)in_stack_fffffffffffffe50);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<char16_t,_QString> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        QString::operator=((QString *)in_stack_fffffffffffffe50,
                           (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        QString::~QString((QString *)0x64d3ba);
        QStringBuilder<char16_t,_QString>::~QStringBuilder
                  ((QStringBuilder<char16_t,_QString> *)0x64d3c7);
        QString::~QString((QString *)0x64d3d4);
        qVar2 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::size(in_RDI)
        ;
        in_stack_fffffffffffffe90.m_data = (void *)(qVar2 + -2);
        while( true ) {
          uVar3 = false;
          if (-1 < (long)in_stack_fffffffffffffe90.m_data) {
            in_stack_fffffffffffffe58 =
                 QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::at
                           (in_RDI,(qsizetype)in_stack_fffffffffffffe90);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)CONCAT17(uVar3,in_stack_fffffffffffffe60),
                       (QString *)in_stack_fffffffffffffe58);
            rhs.m_data = in_stack_fffffffffffffe78;
            rhs.m_size = qVar2;
            uVar3 = QtPrivate::operator!=(&in_stack_fffffffffffffe58->prefix,rhs);
          }
          if ((bool)uVar3 == false) break;
          in_stack_fffffffffffffe90.m_data = in_stack_fffffffffffffe90.m_data + -1;
        }
      } while (-1 < (long)in_stack_fffffffffffffe90.m_data);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)(ulong)in_stack_fffffffffffffe60,
                 (QString *)in_stack_fffffffffffffe58);
      s_00.m_size = in_stack_fffffffffffffe98;
      s_00.field_0.m_data = in_stack_fffffffffffffe90.m_data;
      QXmlStreamPrivateTagStack::addToStringStorage(in_stack_fffffffffffffe80,s_00);
      (local_128->prefix).m_string = local_d8;
      (local_128->prefix).m_pos = local_d0;
      (local_128->prefix).m_size = local_c8;
      QString::~QString((QString *)0x64d53a);
    }
    s_01.m_size = in_stack_fffffffffffffe98;
    s_01.field_0.m_data = in_stack_fffffffffffffe90.m_data;
    QXmlStreamPrivateTagStack::addToStringStorage(in_stack_fffffffffffffe80,s_01);
    (local_128->namespaceUri).m_string = local_100;
    (local_128->namespaceUri).m_pos = local_f8;
    (local_128->namespaceUri).m_size = local_f0;
    if ((in_CL & 1) != 0) {
      writeNamespaceDeclaration(local_10,local_18);
    }
  }
LAB_0064d5df:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_128;
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &QXmlStreamWriterPrivate::findNamespace(QAnyStringView namespaceUri, bool writeDeclaration, bool noDefault)
{
    for (NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
        if (namespaceDeclaration.namespaceUri == namespaceUri) {
            if (!noDefault || !namespaceDeclaration.prefix.isEmpty())
                return namespaceDeclaration;
        }
    }
    if (namespaceUri.isEmpty())
        return emptyNamespace;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    if (namespaceUri.isEmpty()) {
        namespaceDeclaration.prefix.clear();
    } else {
        QString s;
        int n = ++namespacePrefixCount;
        forever {
            s = u'n' + QString::number(n++);
            qsizetype j = namespaceDeclarations.size() - 2;
            while (j >= 0 && namespaceDeclarations.at(j).prefix != s)
                --j;
            if (j < 0)
                break;
        }
        namespaceDeclaration.prefix = addToStringStorage(s);
    }